

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SmallVector<spirv_cross::SPIRBlock::Case,_8UL> * __thiscall
spirv_cross::SmallVector<spirv_cross::SPIRBlock::Case,_8UL>::operator=
          (SmallVector<spirv_cross::SPIRBlock::Case,_8UL> *this,
          SmallVector<spirv_cross::SPIRBlock::Case,_8UL> *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  undefined8 uVar4;
  long lVar5;
  size_t i;
  ulong uVar6;
  
  if (this != other) {
    (this->super_VectorView<spirv_cross::SPIRBlock::Case>).buffer_size = 0;
    reserve(this,(other->super_VectorView<spirv_cross::SPIRBlock::Case>).buffer_size);
    lVar5 = 0;
    for (uVar6 = 0; uVar3 = (other->super_VectorView<spirv_cross::SPIRBlock::Case>).buffer_size,
        uVar6 < uVar3; uVar6 = uVar6 + 1) {
      puVar1 = (undefined8 *)
               ((long)&((other->super_VectorView<spirv_cross::SPIRBlock::Case>).ptr)->value + lVar5)
      ;
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)
               ((long)&((this->super_VectorView<spirv_cross::SPIRBlock::Case>).ptr)->value + lVar5);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      lVar5 = lVar5 + 0x10;
    }
    (this->super_VectorView<spirv_cross::SPIRBlock::Case>).buffer_size = uVar3;
  }
  return this;
}

Assistant:

SmallVector &operator=(const SmallVector &other) SPIRV_CROSS_NOEXCEPT
	{
		if (this == &other)
			return *this;

		clear();
		reserve(other.buffer_size);
		for (size_t i = 0; i < other.buffer_size; i++)
			new (&this->ptr[i]) T(other.ptr[i]);
		this->buffer_size = other.buffer_size;
		return *this;
	}